

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  rawSeq *prVar2;
  BYTE *pBVar3;
  U32 minMatch;
  BYTE *pBVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  BYTE *pBVar11;
  ZSTD_dictMode_e dictMode;
  BYTE *pBVar12;
  BYTE *pBVar13;
  ulong uVar14;
  BYTE *pBVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  
  if ((ms->window).lowLimit < (ms->window).dictLimit) {
    dictMode = ZSTD_extDict;
  }
  else if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
    dictMode = ZSTD_noDict;
  }
  else {
    dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar7;
  }
  uVar18 = rawSeqStore->pos;
  uVar9 = rawSeqStore->size;
  if (uVar9 < uVar18) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x2ad,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < uVar9) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x2ae,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  pBVar15 = (BYTE *)(srcSize + (long)src);
  pBVar1 = pBVar15 + -0x20;
  while ((uVar17 = (long)pBVar15 - (long)src, uVar18 < uVar9 && (src < pBVar15))) {
    prVar2 = rawSeqStore->seq + uVar18;
    uVar9._0_4_ = prVar2->offset;
    uVar9._4_4_ = prVar2->litLength;
    if ((undefined4)uVar9 == 0) {
      __assert_fail("sequence.offset > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x26f,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
    }
    uVar14 = uVar9 >> 0x20;
    uVar8 = rawSeqStore->seq[uVar18].matchLength;
    uVar16 = (uint)uVar17;
    if (uVar16 < uVar8 + uVar9._4_4_) {
      ZSTD_ldm_skipSequences(rawSeqStore,uVar17 & 0xffffffff,minMatch);
      uVar18 = uVar9 & 0xffffffff;
      if (uVar16 - uVar9._4_4_ < minMatch) {
        uVar18 = 0;
      }
      uVar8 = uVar16 - uVar9._4_4_;
      if ((uVar16 < (uint)uVar9._4_4_ || uVar8 == 0) || (uVar9 = uVar18, uVar8 < minMatch)) break;
    }
    else {
      rawSeqStore->pos = uVar18 + 1;
    }
    pBVar3 = (BYTE *)((long)src + uVar14);
    if (pBVar15 < pBVar3 + uVar8) {
      __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x2b9,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                   );
    }
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,src);
    sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar14);
    for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -4) {
      *(undefined4 *)((long)rep + lVar10) = *(undefined4 *)((long)rep + lVar10 + -4);
    }
    *rep = (U32)uVar9;
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar4 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar4 + sVar7) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar15 < pBVar3) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar12 = pBVar3 + -sVar7;
    if (pBVar1 < pBVar3) {
      pBVar11 = pBVar4;
      pBVar13 = pBVar12;
      if (pBVar12 <= pBVar1) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar4 + (-0x10 - (long)pBVar12)) {
LAB_005e73db:
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        pBVar11 = pBVar4 + ((long)pBVar1 - (long)pBVar12);
        uVar6 = *(undefined8 *)(pBVar12 + 8);
        *(undefined8 *)pBVar4 = *(undefined8 *)pBVar12;
        *(undefined8 *)(pBVar4 + 8) = uVar6;
        pBVar13 = pBVar1;
        if (0x10 < (long)pBVar1 - (long)pBVar12) {
          lVar10 = 0x10;
          do {
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar10 + (uVar14 - sVar7)) + 8);
            pBVar12 = pBVar4 + lVar10;
            *(undefined8 *)pBVar12 = *(undefined8 *)((long)src + lVar10 + (uVar14 - sVar7));
            *(undefined8 *)(pBVar12 + 8) = uVar6;
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar10 + (uVar14 - sVar7) + 0x10) + 8);
            *(undefined8 *)(pBVar12 + 0x10) =
                 *(undefined8 *)((long)src + lVar10 + (uVar14 - sVar7) + 0x10);
            *(undefined8 *)(pBVar12 + 0x18) = uVar6;
            lVar10 = lVar10 + 0x20;
          } while (pBVar12 + 0x20 < pBVar11);
        }
      }
      for (; pBVar13 < pBVar3; pBVar13 = pBVar13 + 1) {
        *pBVar11 = *pBVar13;
        pBVar11 = pBVar11 + 1;
      }
LAB_005e7184:
      seqStore->lit = seqStore->lit + sVar7;
      if (0xffff < sVar7) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)(pBVar12 + 8);
      *(undefined8 *)pBVar4 = *(undefined8 *)pBVar12;
      *(undefined8 *)(pBVar4 + 8) = uVar6;
      pBVar4 = seqStore->lit;
      if (0x10 < sVar7) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar4 + 0x10 + (-0x10 - (long)(pBVar12 + 0x10)))
        goto LAB_005e73db;
        uVar6 = *(undefined8 *)(pBVar12 + 0x18);
        *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)(pBVar12 + 0x10);
        *(undefined8 *)(pBVar4 + 0x18) = uVar6;
        if (0x20 < (long)sVar7) {
          lVar10 = 0;
          do {
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar10 + (uVar14 - sVar7) + 0x20) + 8);
            pBVar12 = pBVar4 + lVar10 + 0x20;
            *(undefined8 *)pBVar12 = *(undefined8 *)((long)src + lVar10 + (uVar14 - sVar7) + 0x20);
            *(undefined8 *)(pBVar12 + 8) = uVar6;
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar10 + (uVar14 - sVar7) + 0x30) + 8);
            *(undefined8 *)(pBVar12 + 0x10) =
                 *(undefined8 *)((long)src + lVar10 + (uVar14 - sVar7) + 0x30);
            *(undefined8 *)(pBVar12 + 0x18) = uVar6;
            lVar10 = lVar10 + 0x20;
          } while (pBVar12 + 0x20 < pBVar4 + sVar7);
        }
        goto LAB_005e7184;
      }
      seqStore->lit = pBVar4 + sVar7;
    }
    psVar5 = seqStore->sequences;
    psVar5->litLength = (U16)sVar7;
    psVar5->offBase = (U32)uVar9 + 3;
    if (uVar8 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar18 = (ulong)uVar8 - 3;
    if (0xffff < uVar18) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar5->mlBase = (U16)uVar18;
    seqStore->sequences = psVar5 + 1;
    uVar18 = rawSeqStore->pos;
    uVar9 = rawSeqStore->size;
    src = pBVar3 + uVar8;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,src);
  sVar7 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar17);
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}